

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blockchain.cpp
# Opt level: O2

void CalculatePercentilesByWeight
               (CAmount *result,
               vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_> *scores,
               int64_t total_weight)

{
  pointer ppVar1;
  int64_t i;
  long lVar2;
  pointer ppVar3;
  long lVar4;
  vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_> *__range1;
  long in_FS_OFFSET;
  double dVar5;
  double local_48 [4];
  double local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  if ((scores->super__Vector_base<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>).
      _M_impl.super__Vector_impl_data._M_start !=
      (scores->super__Vector_base<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>).
      _M_impl.super__Vector_impl_data._M_finish) {
    std::
    __sort<__gnu_cxx::__normal_iterator<std::pair<long,long>*,std::vector<std::pair<long,long>,std::allocator<std::pair<long,long>>>>,__gnu_cxx::__ops::_Iter_less_iter>
              ();
    dVar5 = (double)total_weight;
    local_48[0] = dVar5 / 10.0;
    local_48[1] = dVar5 * 0.25;
    local_48[2] = dVar5 * 0.5;
    local_48[3] = dVar5 * 3.0 * 0.25;
    local_28 = (dVar5 * 9.0) / 10.0;
    ppVar1 = (scores->
             super__Vector_base<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>).
             _M_impl.super__Vector_impl_data._M_finish;
    lVar4 = 0;
    lVar2 = 0;
    for (ppVar3 = (scores->
                  super__Vector_base<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>
                  )._M_impl.super__Vector_impl_data._M_start; ppVar3 != ppVar1; ppVar3 = ppVar3 + 1)
    {
      lVar4 = lVar4 + ppVar3->second;
      for (; (lVar2 < 5 && (local_48[lVar2] <= (double)lVar4)); lVar2 = lVar2 + 1) {
        result[lVar2] = ppVar3->first;
      }
    }
    for (; lVar2 < 5; lVar2 = lVar2 + 1) {
      result[lVar2] = ppVar1[-1].first;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void CalculatePercentilesByWeight(CAmount result[NUM_GETBLOCKSTATS_PERCENTILES], std::vector<std::pair<CAmount, int64_t>>& scores, int64_t total_weight)
{
    if (scores.empty()) {
        return;
    }

    std::sort(scores.begin(), scores.end());

    // 10th, 25th, 50th, 75th, and 90th percentile weight units.
    const double weights[NUM_GETBLOCKSTATS_PERCENTILES] = {
        total_weight / 10.0, total_weight / 4.0, total_weight / 2.0, (total_weight * 3.0) / 4.0, (total_weight * 9.0) / 10.0
    };

    int64_t next_percentile_index = 0;
    int64_t cumulative_weight = 0;
    for (const auto& element : scores) {
        cumulative_weight += element.second;
        while (next_percentile_index < NUM_GETBLOCKSTATS_PERCENTILES && cumulative_weight >= weights[next_percentile_index]) {
            result[next_percentile_index] = element.first;
            ++next_percentile_index;
        }
    }

    // Fill any remaining percentiles with the last value.
    for (int64_t i = next_percentile_index; i < NUM_GETBLOCKSTATS_PERCENTILES; i++) {
        result[i] = scores.back().first;
    }
}